

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O3

void drawFaces(Mat *img,vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *faces)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer pRVar3;
  ulong uVar4;
  long lVar5;
  long *local_98;
  undefined8 uStack_90;
  long local_88 [3];
  int local_70;
  int local_6c;
  undefined8 local_68;
  _InputArray local_60;
  long *local_48;
  undefined8 uStack_40;
  
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"draw faces","");
  cv::namedWindow((string *)&local_98,1);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  pRVar3 = (faces->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((faces->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pRVar3) {
    lVar5 = 0xc;
    uVar4 = 0;
    local_48 = (long *)0x0;
    uStack_40 = 0x406fe00000000000;
    do {
      uVar1 = *(undefined8 *)((long)pRVar3 + lVar5 + -0xc);
      uVar2 = *(undefined8 *)((long)pRVar3 + lVar5 + -4);
      local_68 = CONCAT44((int)((ulong)uVar2 >> 0x20) / 2 + (int)((ulong)uVar1 >> 0x20),
                          (int)uVar2 / 2 + (int)uVar1);
      local_60.sz.width = 0;
      local_60.sz.height = 0;
      local_60.flags = 0x3010000;
      local_70 = *(int *)((long)pRVar3 + lVar5 + -4) / 2;
      local_6c = (int)((double)*(int *)((long)&pRVar3->x + lVar5) / 1.5);
      local_98 = local_48;
      uStack_90 = uStack_40;
      local_88[0] = 0;
      local_88[1] = 0;
      local_60.obj = img;
      cv::ellipse(&local_60,&local_68,&local_70,&local_98,2,8,0);
      uVar4 = uVar4 + 1;
      pRVar3 = (faces->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)((long)(faces->
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 4))
    ;
  }
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"draw faces","");
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x1010000;
  local_60.obj = img;
  cv::imshow((string *)&local_98,&local_60);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return;
}

Assistant:

void drawFaces(Mat img, vector<Rect> faces) {
  namedWindow("draw faces");
  for (size_t i = 0; i < faces.size(); i++) {
    // 先确定人脸矩形中心坐标,再根据该坐标画椭圆
    Point center(faces[i].x + faces[i].width / 2,
                 faces[i].y + faces[i].height / 2);
    ellipse(img, center, Size(faces[i].width / 2, faces[i].height / 1.5), 0, 0,
            360, Scalar(0, 255, 0), 2, 8, 0);
  }
  imshow("draw faces", img);
}